

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

uint get_terminal_columns(void)

{
  int iVar1;
  undefined1 local_34 [2];
  ushort local_32;
  winsize ts;
  int cols;
  char *p;
  curl_off_t num;
  char *colp;
  uint width;
  
  colp._4_4_ = 0;
  num = curl_getenv();
  if (num != 0) {
    unique0x100000b4 = num;
    iVar1 = Curl_str_number((char **)&ts.ws_xpixel,(curl_off_t *)&p,10000);
    if ((iVar1 == 0) && (0x14 < (long)p)) {
      colp._4_4_ = (uint)p;
    }
    curl_free();
  }
  if (colp._4_4_ == 0) {
    ts.ws_row = 0;
    ts.ws_col = 0;
    iVar1 = ioctl(0,0x5413,local_34);
    if (iVar1 == 0) {
      ts._0_4_ = ZEXT24(local_32);
    }
    if ((-1 < (int)ts._0_4_) && ((int)ts._0_4_ < 10000)) {
      colp._4_2_ = ts.ws_row;
      colp._6_2_ = ts.ws_col;
    }
  }
  if (colp._4_4_ == 0) {
    colp._4_4_ = 0x4f;
  }
  return colp._4_4_;
}

Assistant:

unsigned int get_terminal_columns(void)
{
  unsigned int width = 0;
  char *colp = curl_getenv("COLUMNS");
  if(colp) {
    curl_off_t num;
    const char *p = colp;
    if(!curlx_str_number(&p, &num, 10000) && (num > 20))
      width = (unsigned int)num;
    curl_free(colp);
  }

  if(!width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = (int)ts.ws_col;
#elif defined(_WIN32) && !defined(CURL_WINDOWS_UWP) && !defined(UNDER_CE)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    if(cols >= 0 && cols < 10000)
      width = (unsigned int)cols;
  }
  if(!width)
    width = 79;
  return width; /* 79 for unknown, might also be tiny or enormous */
}